

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O3

_Bool hpa_hugify_blocked_by_ndirty(tsdn_t *tsdn,hpa_shard_t *shard)

{
  ulong uVar1;
  bool bVar2;
  hpdata_t *phVar3;
  ulong uVar4;
  
  phVar3 = duckdb_je_psset_pick_hugify
                     ((psset_t *)
                      ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow
                       .lg_fill_div + 8));
  if (phVar3 == (hpdata_t *)0x0) {
    bVar2 = false;
  }
  else {
    uVar4 = (ulong)*(uint *)(tsdn[2].tsd.
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
                             bin_refilled + 0xc);
    if (uVar4 == 0xffffffff) {
      uVar4 = 0xffffffffffffffff;
    }
    else {
      uVar1 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins[0x14].
              tstats.nrequests;
      if (uVar1 >> 0x30 == 0) {
        uVar4 = uVar1 * uVar4 >> 0x10;
      }
      else {
        uVar4 = (uVar1 >> 0x10) * uVar4;
      }
    }
    bVar2 = uVar4 < (*(long *)&(tsdn->tsd).
                               cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins
                               [0x14].low_bits_low_water -
                    (*(long *)(tsdn[2].tsd.
                               cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
                               bin_flush_delay_items + 8) + phVar3->h_ntouched)) + 0x200;
  }
  return bVar2;
}

Assistant:

static bool
hpa_hugify_blocked_by_ndirty(tsdn_t *tsdn, hpa_shard_t *shard) {
	malloc_mutex_assert_owner(tsdn, &shard->mtx);
	hpdata_t *to_hugify = psset_pick_hugify(&shard->psset);
	if (to_hugify == NULL) {
		return false;
	}
	return hpa_adjusted_ndirty(tsdn, shard)
	    + hpdata_nretained_get(to_hugify) > hpa_ndirty_max(tsdn, shard);
}